

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

ctmbstr prvTidygetNextPriorityAttr(TidyDocImpl *doc,TidyIterator *iter)

{
  ctmbstr ptVar1;
  TidyIterator p_Var2;
  TidyIterator p_Var3;
  TidyIterator p_Var4;
  
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/attrs.c"
                  ,1000,"ctmbstr prvTidygetNextPriorityAttr(TidyDocImpl *, TidyIterator *)");
  }
  p_Var2 = *iter;
  p_Var3 = (TidyIterator)(ulong)(doc->attribs).priorityAttribs.count;
  if (p_Var2 == (TidyIterator)0x0) {
    p_Var2 = (TidyIterator)0x0;
  }
  else if (p_Var2 <= p_Var3) {
    ptVar1 = (doc->attribs).priorityAttribs.list[(long)((long)&p_Var2[-1]._opaque + 3)];
    p_Var2 = (TidyIterator)((long)&p_Var2->_opaque + 1);
    goto LAB_0013b5da;
  }
  ptVar1 = (ctmbstr)0x0;
LAB_0013b5da:
  p_Var4 = (TidyIterator)0x0;
  if (p_Var2 <= p_Var3) {
    p_Var4 = p_Var2;
  }
  *iter = p_Var4;
  return ptVar1;
}

Assistant:

ctmbstr  TY_(getNextPriorityAttr)( TidyDocImpl* doc, TidyIterator* iter )
{
    PriorityAttribs *priorities = &(doc->attribs.priorityAttribs);
    size_t index;
    ctmbstr result = NULL;
    assert( iter != NULL );
    index = (size_t)*iter;

    if ( index > 0 && index <= priorities->count )
    {
        result = priorities->list[index-1];
        index++;
    }
    *iter = (TidyIterator) ( index <= priorities->count ? index : (size_t)0 );

    return result;
}